

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::VertexCubeTextureCase::iterate(VertexCubeTextureCase *this)

{
  float *pfVar1;
  GLuint program;
  int iVar2;
  int iVar3;
  TextureCube *pTVar4;
  RenderContext *context;
  float fVar5;
  CubeFace CVar6;
  deUint32 seed;
  int iVar7;
  int iVar8;
  float fVar9;
  GLuint GVar10;
  GLint GVar11;
  RenderTarget *pRVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  CubeFace CVar16;
  int iVar17;
  char *description;
  int x;
  float fVar18;
  short sVar19;
  int width;
  float fVar20;
  uint uVar21;
  int height;
  int x_1;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  int ix;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  Vec4 color;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> quadColors;
  Vec4 ldru;
  Surface resImage;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vStack_248;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_230;
  float local_214;
  uint local_210;
  uint local_20c;
  int local_208;
  int local_204;
  Vec2 safeFaceCoord;
  Vector<float,_3> local_1f8;
  Vec2 quadVertices [4];
  Vector<float,_3> local_1a4;
  Vec3 coordAB;
  Vec2 local_178;
  Vec2 local_170;
  Vec2 local_168;
  IVec2 local_15c;
  Vec2 rawFaceCoord;
  Vec3 coordAC;
  Vector<int,_2> local_128;
  Surface refImage;
  Vec2 local_108;
  Vec3 texCoord;
  tcu local_f0 [12];
  tcu local_e4 [12];
  Render renders [4];
  Random rnd;
  
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  width = 0xa8;
  if (pRVar12->m_width < 0xa8) {
    width = pRVar12->m_width;
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  height = 0x70;
  if (pRVar12->m_height < 0x70) {
    height = pRVar12->m_height;
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = pRVar12->m_width;
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar12->m_height;
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  iVar7 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar7 - width);
  iVar8 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar8 - height);
  glwUseProgram((this->m_program->m_program).m_program);
  glwClearColor(0.125,0.25,0.5,1.0);
  glwClear(0x4000);
  local_170.m_data[0] = 0.0;
  local_170.m_data[1] = 0.0;
  local_168.m_data[0] = 1.0;
  local_168.m_data[1] = 1.0;
  local_108.m_data[0] = 0.3;
  local_108.m_data[1] = 0.3;
  local_178.m_data[0] = 0.5;
  local_178.m_data[1] = 0.3;
  tcu::Surface::Surface(&refImage,width,height);
  CVar16 = CUBEFACE_NEGATIVE_X;
  uVar25 = (long)width / 6 & 0xffffffff;
  local_210 = (uint)((long)height / 4);
  uVar13 = (long)height / 4 & 0xffffffff;
  local_214 = (float)(height / 2 - local_210);
  local_20c = (uint)((long)width / 6);
  local_208 = width;
  while( true ) {
    fVar27 = (float)uVar13;
    fVar29 = (float)uVar25;
    if (CVar16 == CUBEFACE_LAST) break;
    fVar28 = 0.0;
    if (CUBEFACE_NEGATIVE_Y < CVar16) {
      fVar28 = fVar27;
    }
    fVar18 = (float)(height / 2 + (int)fVar28);
    CVar6 = CVar16;
    fVar30 = fVar27;
    if (CUBEFACE_NEGATIVE_Y < CVar16) {
      fVar27 = (float)(height - (int)fVar18);
      CVar6 = CVar16 - CUBEFACE_POSITIVE_Y;
      fVar30 = local_214;
    }
    iVar22 = CVar6 * (int)fVar29;
    fVar9 = (float)(width / 2 + iVar22);
    fVar20 = (float)(local_208 - (int)fVar9);
    fVar5 = (float)(width / 2 - iVar22);
    if (CVar16 != CUBEFACE_POSITIVE_Z && CVar16 != CUBEFACE_NEGATIVE_Y) {
      fVar20 = fVar29;
      fVar5 = fVar29;
    }
    resImage.m_pixels.m_ptr = (void *)CONCAT44(fVar30,fVar5);
    resImage.m_width = iVar22;
    resImage.m_height = (int)fVar28;
    iterate()::Render::Render(deqp::gles3::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
    Vector<float,2>const&,tcu::Vector<float,2>_const__
              (renders,(Rect *)&resImage,0,&local_168,&local_170);
    quadVertices[0].m_data[1] = fVar28;
    quadVertices[0].m_data[0] = fVar9;
    quadVertices[1].m_data[1] = fVar30;
    quadVertices[1].m_data[0] = fVar20;
    iterate()::Render::Render(deqp::gles3::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
    Vector<float,2>const&,tcu::Vector<float,2>_const__
              (renders + 1,(Rect *)quadVertices,0,&local_108,&local_178);
    quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = iVar22;
    quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start._4_4_ = fVar18;
    quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = fVar5;
    quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish._4_4_ = fVar27;
    iterate()::Render::Render(deqp::gles3::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
    Vector<float,2>const&,tcu::Vector<float,2>_const__
              (renders + 2,(Rect *)&quadColors,1,&local_168,&local_170);
    color.m_data[1] = fVar18;
    color.m_data[0] = fVar9;
    color.m_data[2] = fVar20;
    color.m_data[3] = fVar27;
    iterate()::Render::Render(deqp::gles3::Functional::(anonymous_namespace)::Rect_const&,int,tcu::
    Vector<float,2>const&,tcu::Vector<float,2>_const__
              (renders + 3,(Rect *)&color,1,&local_108,&local_178);
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      quadVertices[0].m_data[0] = (float)renders[lVar14].region.w;
      quadVertices[0].m_data[1] = (float)renders[lVar14].region.h;
      tcu::Vector<int,_2>::cast<float>((Vector<int,_2> *)quadVertices);
      fVar27 = calculateLod(this,&renders[lVar14].texCoordScale,(Vec2 *)&resImage,
                            renders[lVar14].textureNdx);
      iVar22 = *(int *)((long)this->m_textures + (ulong)(fVar27 <= 0.0) * 4 + -0x18);
      local_128.m_data[0] = renders[lVar14].region.w;
      local_128.m_data[1] = renders[lVar14].region.h;
      local_15c.m_data[0] = (this->m_textures[renders[lVar14].textureNdx]->m_refTexture).m_size;
      local_15c.m_data[1] = local_15c.m_data[0];
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&quadColors,&renders[lVar14].texCoordScale);
      tcu::Vector<float,_2>::Vector
                ((Vector<float,_2> *)
                 &quadColors.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,&renders[lVar14].texCoordOffset);
      resImage.m_width = 0x3f;
      local_230.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_230.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_248.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_248.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_248.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      resImage.m_pixels.m_ptr = (void *)0x0;
      resImage.m_pixels.m_cap = 0;
      local_230.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      quadColors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = CVar16;
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                 &resImage.m_pixels,0x3e04);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                (&local_230,(long)(resImage.m_width * resImage.m_width * 6));
      iVar15 = 0;
      iVar23 = resImage.m_width;
      while (iVar15 < iVar23) {
        fVar29 = (float)iVar15;
        iVar15 = iVar15 + 1;
        iVar17 = 0;
        while( true ) {
          if (iVar23 <= iVar17) break;
          fVar28 = (float)iVar17;
          iVar17 = iVar17 + 1;
          quadVertices[3].m_data[0] = (float)iVar17 / 63.0;
          quadVertices[0].m_data[1] = fVar29 / 63.0;
          quadVertices[0].m_data[0] = fVar28 / 63.0;
          quadVertices[1].m_data[1] = fVar29 / 63.0;
          quadVertices[1].m_data[0] = quadVertices[3].m_data[0];
          quadVertices[2].m_data[1] = (float)iVar15 / 63.0;
          quadVertices[2].m_data[0] = fVar28 / 63.0;
          uVar21 = (int)resImage.m_pixels.m_cap - (int)resImage.m_pixels.m_ptr;
          quadVertices[3].m_data[1] = (float)iVar15 / 63.0;
          for (lVar24 = 0; lVar24 != 0x20; lVar24 = lVar24 + 8) {
            coordAB.m_data[0] = 0.0;
            coordAB.m_data[1] = 0.0;
            safeCoords<2>((Functional *)&local_1f8,
                          (Vector<float,_2> *)((long)quadVertices[0].m_data + lVar24),&local_128,
                          (Vector<float,_2> *)&coordAB);
            tcu::operator*(2.0,(Vector<float,_2> *)&local_1f8);
            tcu::operator-((Vector<float,_2> *)&ldru,1.0);
            std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
            emplace_back<tcu::Vector<float,2>>
                      ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                       &resImage.m_pixels,(Vector<float,_2> *)&color);
          }
          sVar19 = (short)(uVar21 >> 3);
          color.m_data[0]._0_2_ = sVar19;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (&local_230,(unsigned_short *)&color);
          color.m_data[0]._0_2_ = sVar19 + 1;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (&local_230,(unsigned_short *)&color);
          color.m_data[0]._0_2_ = sVar19 + 2;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (&local_230,(unsigned_short *)&color);
          color.m_data[0]._0_2_ = sVar19 + 1;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (&local_230,(unsigned_short *)&color);
          color.m_data[0]._0_2_ = sVar19 + 3;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (&local_230,(unsigned_short *)&color);
          color.m_data[0]._0_2_ = sVar19 + 2;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (&local_230,(unsigned_short *)&color);
          iVar23 = resImage.m_width;
        }
      }
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::reserve
                (&vStack_248,(long)(iVar23 * iVar23 * 4));
      fVar29 = (float)resImage.m_width;
      quadVertices[0].m_data[0] = 0.0;
      quadVertices[0].m_data[1] = 0.0;
      quadVertices[1].m_data[0] = 0.0;
      quadVertices[1].m_data[1] = 0.0;
      quadVertices[2].m_data[0] = 0.0;
      quadVertices[2].m_data[1] = 0.0;
      glu::TextureTestUtil::computeQuadTexCoordCube
                ((vector<float,_std::allocator<float>_> *)quadVertices,
                 (CubeFace)
                 quadColors.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      color.m_data[2] = *(float *)((long)quadVertices[0].m_data + 8);
      color.m_data._0_8_ = *(undefined8 *)quadVertices[0].m_data;
      ldru.m_data[2] = *(float *)((long)quadVertices[0].m_data + 0x14);
      ldru.m_data._0_8_ = *(undefined8 *)((long)quadVertices[0].m_data + 0xc);
      local_1f8.m_data[2] = *(float *)((long)quadVertices[0].m_data + 0x20);
      local_1f8.m_data._0_8_ = *(undefined8 *)((long)quadVertices[0].m_data + 0x18);
      tcu::operator-((tcu *)&coordAB,(Vector<float,_3> *)&ldru,(Vector<float,_3> *)&color);
      tcu::operator-((tcu *)&coordAC,&local_1f8,(Vector<float,_3> *)&color);
      iVar23 = resImage.m_width;
      for (iVar15 = 0; iVar15 < iVar23; iVar15 = iVar15 + 1) {
        for (iVar17 = 0; iVar17 < iVar23; iVar17 = iVar17 + 1) {
          local_1a4.m_data[0] = (float)iVar17 / fVar29;
          local_1a4.m_data[1] = (float)iVar15 / fVar29;
          tcu::operator*((Vector<float,_2> *)&quadColors,(Vector<float,_2> *)&local_1a4);
          tcu::operator+((Vector<float,_2> *)&texCoord,
                         (Vector<float,_2> *)
                         &quadColors.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
          if (((iVar22 == 0x2600) || (iVar22 == 0x2702)) || (iVar22 == 0x2700)) {
            safe2DTexCoords((Functional *)&safeFaceCoord,&rawFaceCoord,&local_15c);
          }
          else {
            tcu::Vector<float,_2>::Vector(&safeFaceCoord,&rawFaceCoord);
          }
          tcu::operator*(local_e4,safeFaceCoord.m_data[0],&coordAC);
          tcu::operator+((tcu *)&local_1a4,(Vector<float,_3> *)&color,(Vector<float,_3> *)local_e4);
          tcu::operator*(local_f0,safeFaceCoord.m_data[1],&coordAB);
          tcu::operator+((tcu *)&texCoord,&local_1a4,(Vector<float,_3> *)local_f0);
          iVar23 = 4;
          while (bVar26 = iVar23 != 0, iVar23 = iVar23 + -1, bVar26) {
            std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::push_back
                      (&vStack_248,(value_type *)&texCoord);
          }
          iVar23 = resImage.m_width;
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)quadVertices);
      glwViewport(renders[lVar14].region.x + iVar7,renders[lVar14].region.y + iVar8,
                  renders[lVar14].region.w,renders[lVar14].region.h);
      iVar22 = renders[lVar14].textureNdx;
      program = (this->m_program->m_program).m_program;
      GVar10 = glwGetAttribLocation(program,"a_position");
      if (GVar10 != 0xffffffff) {
        glwEnableVertexAttribArray(GVar10);
        glwVertexAttribPointer(GVar10,2,0x1406,'\0',0,resImage.m_pixels.m_ptr);
      }
      GVar10 = glwGetAttribLocation(program,"a_texCoord");
      if (GVar10 != 0xffffffff) {
        glwEnableVertexAttribArray(GVar10);
        glwVertexAttribPointer
                  (GVar10,3,0x1406,'\0',0,
                   vStack_248.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      GVar11 = glwGetUniformLocation(program,"u_lod");
      if (GVar11 != -1) {
        glwUniform1f(GVar11,fVar27);
      }
      glwActiveTexture(0x84c0);
      glwBindTexture(0x8513,this->m_textures[iVar22]->m_glTexture);
      glwTexParameteri(0x8513,0x2802,this->m_wrapS);
      glwTexParameteri(0x8513,0x2803,this->m_wrapT);
      glwTexParameteri(0x8513,0x2801,this->m_minFilter);
      glwTexParameteri(0x8513,0x2800,this->m_magFilter);
      GVar11 = glwGetUniformLocation(program,"u_texture");
      if (GVar11 != -1) {
        glwUniform1i(GVar11,0);
      }
      glwDrawElements(4,resImage.m_width * resImage.m_width * 6,0x1403,
                      local_230.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      iVar22 = renders[lVar14].textureNdx;
      glu::mapGLSampler((Sampler *)quadVertices,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                        this->m_magFilter);
      iVar23 = resImage.m_width;
      pTVar4 = this->m_textures[iVar22];
      uVar13 = (ulong)(uint)resImage.m_width;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&quadColors,(long)(resImage.m_width * resImage.m_width),(allocator_type *)&color);
      lVar24 = 0;
      iVar22 = 0;
      if (0 < iVar23) {
        iVar22 = iVar23;
      }
      for (iVar23 = 0; iVar15 = resImage.m_width, iVar23 != iVar22; iVar23 = iVar23 + 1) {
        for (uVar25 = 0; uVar13 != uVar25; uVar25 = uVar25 + 1) {
          iVar15 = (resImage.m_width * iVar23 + (int)uVar25) * 4;
          tcu::TextureCubeView::sample
                    ((TextureCubeView *)&color,(Sampler *)&(pTVar4->m_refTexture).m_view,
                     vStack_248.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar15].m_data[0],
                     vStack_248.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar15].m_data[1],
                     vStack_248.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar15].m_data[2],fVar27);
          pfVar1 = (float *)(CONCAT44(quadColors.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (int)quadColors.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) +
                            (long)((int)lVar24 + (int)uVar25) * 0x10);
          *(undefined8 *)pfVar1 = color.m_data._0_8_;
          *(ulong *)(pfVar1 + 2) = CONCAT44(color.m_data[3],color.m_data[2]);
        }
        lVar24 = lVar24 + uVar13;
      }
      uVar13 = (ulong)(uint)resImage.m_width;
      iVar22 = 0;
      local_204 = 0;
      if (0 < resImage.m_width) {
        local_204 = resImage.m_width;
      }
      for (; iVar22 != local_204; iVar22 = iVar22 + 1) {
        for (uVar25 = 0; uVar25 != uVar13; uVar25 = uVar25 + 1) {
          tcu::Vector<float,_4>::Vector
                    (&color,(Vector<float,_4> *)
                            ((long)(iVar22 * iVar15 + (int)uVar25) * 0x10 +
                            CONCAT44(quadColors.
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)quadColors.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)));
          iVar23 = resImage.m_width * iVar22 + (int)uVar25;
          coordAB.m_data._0_8_ =
               *(undefined8 *)((long)resImage.m_pixels.m_ptr + (long)(iVar23 * 4) * 8);
          coordAB.m_data[2] =
               (float)*(undefined8 *)((long)resImage.m_pixels.m_ptr + (long)(iVar23 * 4 + 3) * 8);
          tcu::operator*((tcu *)&local_1f8,0.5,(Vector<float,_4> *)&coordAB);
          tcu::operator+((tcu *)&ldru,0.5,(Vector<float,_4> *)&local_1f8);
          fVar29 = (float)renders[lVar14].region.w;
          fVar27 = ceilf(ldru.m_data[0] * fVar29 + -0.5);
          fVar29 = ceilf(fVar29 * ldru.m_data[2] + -0.5);
          fVar30 = (float)renders[lVar14].region.h;
          fVar28 = ceilf(ldru.m_data[1] * fVar30 + -0.5);
          fVar30 = ceilf(fVar30 * ldru.m_data[3] + -0.5);
          for (iVar23 = (int)fVar28; iVar17 = (int)fVar27, iVar23 < (int)fVar30; iVar23 = iVar23 + 1
              ) {
            for (; iVar17 < (int)fVar29; iVar17 = iVar17 + 1) {
              iVar2 = renders[lVar14].region.x;
              iVar3 = renders[lVar14].region.y;
              tcu::RGBA::RGBA((RGBA *)&coordAC,&color);
              *(float *)((long)refImage.m_pixels.m_ptr +
                        (long)(iVar2 + iVar17 + (iVar3 + iVar23) * refImage.m_width) * 4) =
                   coordAC.m_data[0];
            }
          }
        }
      }
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&quadColors.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      anon_unknown_1::PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1>::
      ~PosTexCoordQuadGrid((PosTexCoordQuadGrid<(glu::TextureTestUtil::TextureType)1> *)&resImage);
    }
    CVar16 = CVar16 + CUBEFACE_POSITIVE_X;
    uVar25 = (ulong)local_20c;
    uVar13 = (ulong)local_210;
  }
  tcu::Surface::Surface(&resImage,local_208,height);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)renders,&resImage);
  glu::readPixels(context,iVar7,iVar8,(PixelBufferAccess *)renders);
  glwUseProgram(0);
  bVar26 = compareImages(((this->super_TestCase).m_context)->m_renderCtx,
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         &refImage,&resImage);
  description = "Image comparison failed";
  if (bVar26) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar26,
             description);
  tcu::Surface::~Surface(&resImage);
  tcu::Surface::~Surface(&refImage);
  return STOP;
}

Assistant:

VertexCubeTextureCase::IterateResult VertexCubeTextureCase::iterate (void)
{
	const int	viewportWidth		= deMin32(m_context.getRenderTarget().getWidth(), MAX_CUBE_RENDER_WIDTH);
	const int	viewportHeight		= deMin32(m_context.getRenderTarget().getHeight(), MAX_CUBE_RENDER_HEIGHT);

	const int	viewportXOffsetMax	= m_context.getRenderTarget().getWidth() - viewportWidth;
	const int	viewportYOffsetMax	= m_context.getRenderTarget().getHeight() - viewportHeight;

	de::Random	rnd					(deStringHash(getName()));

	const int	viewportXOffset		= rnd.getInt(0, viewportXOffsetMax);
	const int	viewportYOffset		= rnd.getInt(0, viewportYOffsetMax);

	glUseProgram(m_program->getProgram());

	// Divide viewport into 4 areas.
	const int leftWidth		= viewportWidth / 2;
	const int rightWidth	= viewportWidth - leftWidth;
	const int bottomHeight	= viewportHeight / 2;
	const int topHeight		= viewportHeight - bottomHeight;

	// Clear.
	glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	// Texture scaling and offsetting vectors.
	const Vec2 texMinScale		(1.0f, 1.0f);
	const Vec2 texMinOffset		(0.0f, 0.0f);
	const Vec2 texMagScale		(0.3f, 0.3f);
	const Vec2 texMagOffset		(0.5f, 0.3f);

	// Surface for the reference image.
	tcu::Surface refImage(viewportWidth, viewportHeight);

	// Each of the four areas is divided into 6 cells.
	const int defCellWidth	= viewportWidth / 2 / 3;
	const int defCellHeight	= viewportHeight / 2 / 2;

	for (int i = 0; i < tcu::CUBEFACE_LAST; i++)
	{
		const int	cellOffsetX			= defCellWidth * (i % 3);
		const int	cellOffsetY			= defCellHeight * (i / 3);
		const bool	isRightmostCell		= i == 2 || i == 5;
		const bool	isTopCell			= i >= 3;
		const int	leftCellWidth		= isRightmostCell	? leftWidth		- cellOffsetX : defCellWidth;
		const int	rightCellWidth		= isRightmostCell	? rightWidth	- cellOffsetX : defCellWidth;
		const int	bottomCellHeight	= isTopCell			? bottomHeight	- cellOffsetY : defCellHeight;
		const int	topCellHeight		= isTopCell			? topHeight		- cellOffsetY : defCellHeight;

		const struct Render
		{
			const Rect	region;
			int			textureNdx;
			const Vec2	texCoordScale;
			const Vec2	texCoordOffset;
			Render (const Rect& r, int tN, const Vec2& tS, const Vec2& tO) : region(r), textureNdx(tN), texCoordScale(tS), texCoordOffset(tO) {}
		} renders[] =
		{
			Render(Rect(cellOffsetX + 0,			cellOffsetY + 0,				leftCellWidth,	bottomCellHeight),	0, texMinScale, texMinOffset),
			Render(Rect(cellOffsetX + leftWidth,	cellOffsetY + 0,				rightCellWidth,	bottomCellHeight),	0, texMagScale, texMagOffset),
			Render(Rect(cellOffsetX + 0,			cellOffsetY + bottomHeight,		leftCellWidth,	topCellHeight),		1, texMinScale, texMinOffset),
			Render(Rect(cellOffsetX + leftWidth,	cellOffsetY + bottomHeight,		rightCellWidth,	topCellHeight),		1, texMagScale, texMagOffset)
		};

		for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renders); renderNdx++)
		{
			const Render&	rend				= renders[renderNdx];
			const float		lod					= calculateLod(rend.texCoordScale, rend.region.size().asFloat(), rend.textureNdx);
			const bool		useSafeTexCoords	= isLevelNearest(lod > 0.0f ? m_minFilter : m_magFilter);
			const Grid		grid				(GRID_SIZE_CUBE, rend.region.size(), getTextureSize(*m_textures[rend.textureNdx]),
												 TexTypeCoordParams<TEXTURETYPE_CUBE>(rend.texCoordScale, rend.texCoordOffset, (tcu::CubeFace)i), useSafeTexCoords);

			glViewport(viewportXOffset + rend.region.x, viewportYOffset + rend.region.y, rend.region.w, rend.region.h);
			renderCell				(rend.textureNdx, lod, grid);
			computeReferenceCell	(rend.textureNdx, lod, grid, refImage, rend.region);
		}
	}

	// Read back rendered results.
	tcu::Surface resImage(viewportWidth, viewportHeight);
	glu::readPixels(m_context.getRenderContext(), viewportXOffset, viewportYOffset, resImage.getAccess());

	glUseProgram(0);

	// Compare and log.
	{
		const bool isOk = compareImages(m_context.getRenderContext(), m_testCtx.getLog(), refImage, resImage);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}